

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasEnumDefinitions(FileDescriptor *file)

{
  bool bVar1;
  ulong uVar2;
  Descriptor *message_type;
  ulong uVar3;
  
  bVar1 = true;
  if (*(int *)(file + 0x68) < 1) {
    uVar3 = (ulong)*(int *)(file + 0x58);
    if ((long)uVar3 < 1) {
      bVar1 = false;
    }
    else {
      message_type = *(Descriptor **)(file + 0x60);
      uVar2 = 0;
      do {
        bVar1 = HasEnumDefinitions(message_type);
        if (bVar1) {
          return true;
        }
        uVar2 = uVar2 + 1;
        message_type = message_type + 0xa8;
      } while (uVar3 != uVar2);
      bVar1 = uVar2 < uVar3;
    }
  }
  return bVar1;
}

Assistant:

bool HasEnumDefinitions(const FileDescriptor* file) {
  if (file->enum_type_count() > 0) return true;
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (HasEnumDefinitions(file->message_type(i))) return true;
  }
  return false;
}